

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O2

int Fx_ManDivFindCubeFree(Vec_Int_t *vArr1,Vec_Int_t *vArr2,Vec_Int_t *vCubeFree,int *fWarning)

{
  int *piVar1;
  int Var;
  int iVar2;
  int iVar3;
  int *piVar4;
  char *__s;
  int *piVar5;
  int *piVar6;
  int local_40;
  int local_3c;
  
  piVar4 = vArr1->pArray;
  piVar5 = vArr2->pArray;
  piVar1 = piVar4 + vArr1->nSize;
  piVar6 = piVar5 + vArr2->nSize;
  vCubeFree->nSize = 0;
  local_3c = 0;
  iVar3 = 0;
  local_40 = 1;
LAB_0023c418:
  piVar4 = piVar4 + 1;
  do {
    piVar5 = piVar5 + 1;
    while( true ) {
      if ((piVar1 <= piVar4) || (piVar6 <= piVar5)) goto LAB_0023c497;
      iVar2 = *piVar4;
      Var = *piVar5;
      if (iVar2 == Var) {
        local_3c = local_3c + 1;
        goto LAB_0023c418;
      }
      if (Var <= iVar2) break;
      piVar4 = piVar4 + 1;
      iVar2 = Abc_Var2Lit(iVar2,iVar3);
      Vec_IntPush(vCubeFree,iVar2);
    }
    if (vCubeFree->nSize == 0) {
      iVar3 = 1;
      local_40 = 0;
    }
    iVar2 = Abc_Var2Lit(Var,local_40);
    Vec_IntPush(vCubeFree,iVar2);
  } while( true );
LAB_0023c497:
  for (; piVar4 < piVar1; piVar4 = piVar4 + 1) {
    iVar2 = Abc_Var2Lit(*piVar4,iVar3);
    Vec_IntPush(vCubeFree,iVar2);
  }
  for (; piVar5 < piVar6; piVar5 = piVar5 + 1) {
    iVar3 = Abc_Var2Lit(*piVar5,local_40);
    Vec_IntPush(vCubeFree,iVar3);
  }
  iVar3 = vCubeFree->nSize;
  if (iVar3 == 2) {
    iVar3 = Vec_IntEntry(vCubeFree,0);
    iVar3 = Abc_Lit2Var(iVar3);
    iVar3 = Abc_Lit2Var(iVar3);
    iVar2 = Vec_IntEntry(vCubeFree,1);
    iVar2 = Abc_Lit2Var(iVar2);
    iVar2 = Abc_Lit2Var(iVar2);
    if ((iVar3 == iVar2) && (*fWarning == 0)) {
      puts(
          "The SOP has distance-1 cubes or it is not a prime cover.  Please make sure the result verifies."
          );
      *fWarning = 1;
    }
  }
  else {
    if (iVar3 == 1) {
      __s = "The SOP has contained cubes.";
    }
    else {
      if (iVar3 != 0) goto LAB_0023c4e7;
      __s = "The SOP has duplicated cubes.";
    }
    puts(__s);
  }
LAB_0023c4e7:
  iVar3 = Vec_IntEntry(vCubeFree,0);
  iVar3 = Abc_LitIsCompl(iVar3);
  if (iVar3 == 0) {
    return local_3c;
  }
  __assert_fail("!Abc_LitIsCompl(Vec_IntEntry(vCubeFree, 0))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                ,0x29d,"int Fx_ManDivFindCubeFree(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int *)");
}

Assistant:

int Fx_ManDivFindCubeFree( Vec_Int_t * vArr1, Vec_Int_t * vArr2, Vec_Int_t * vCubeFree, int * fWarning )
{
    int * pBeg1 = vArr1->pArray + 1;  // skip variable ID
    int * pBeg2 = vArr2->pArray + 1;  // skip variable ID
    int * pEnd1 = vArr1->pArray + vArr1->nSize;
    int * pEnd2 = vArr2->pArray + vArr2->nSize;
    int Counter = 0, fAttr0 = 0, fAttr1 = 1;
    Vec_IntClear( vCubeFree );
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            pBeg1++, pBeg2++, Counter++;
        else if ( *pBeg1 < *pBeg2 )
            Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg1++, fAttr0) );
        else  
        {
            if ( Vec_IntSize(vCubeFree) == 0 )
                fAttr0 = 1, fAttr1 = 0;
            Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg2++, fAttr1) );
        }
    }
    while ( pBeg1 < pEnd1 )
        Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg1++, fAttr0) );
    while ( pBeg2 < pEnd2 )
        Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg2++, fAttr1) );
    if ( Vec_IntSize(vCubeFree) == 0 )
        printf( "The SOP has duplicated cubes.\n" );
    else if ( Vec_IntSize(vCubeFree) == 1 )
        printf( "The SOP has contained cubes.\n" );
    else if ( Vec_IntSize(vCubeFree) == 2 && Abc_Lit2Var(Abc_Lit2Var(Vec_IntEntry(vCubeFree, 0))) == Abc_Lit2Var(Abc_Lit2Var(Vec_IntEntry(vCubeFree, 1))) && !*fWarning )
        printf( "The SOP has distance-1 cubes or it is not a prime cover.  Please make sure the result verifies.\n" ), *fWarning = 1;
    assert( !Abc_LitIsCompl(Vec_IntEntry(vCubeFree, 0)) );
    return Counter;
}